

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CFieldList *stm)

{
  CField *pCVar1;
  pointer puVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_38 [8];
  char local_30 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: fieldlist\n",0x17);
  puVar2 = (stm->fields).
           super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((stm->fields).
      super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar4 = 0;
    do {
      pCVar1 = puVar2[uVar4]._M_t.super___uniq_ptr_impl<CField,_std::default_delete<CField>_>._M_t.
               super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
               super__Head_base<0UL,_CField_*,_false>._M_head_impl;
      if (pCVar1 == (CField *)0x0) {
        CError::CError((CError *)local_48,&CError::AST_ERROR_abi_cxx11_,
                       &(stm->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_48);
        pcVar3 = local_38;
        local_40._M_p = (pointer)local_48;
        goto LAB_001217e0;
      }
      (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
      uVar4 = uVar4 + 1;
      puVar2 = (stm->fields).
               super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(stm->fields).
                                   super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  TypeInfo::TypeInfo((TypeInfo *)local_48,VOID);
  (this->lastCalculatedType).isPrimitive = (bool)local_48[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_48._1_3_;
  (this->lastCalculatedType).type = local_48._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_40);
  pcVar3 = local_30;
LAB_001217e0:
  if (local_40._M_p != pcVar3) {
    operator_delete(local_40._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CFieldList &stm ) 
{
	std::cout << "typechecker: fieldlist\n";
    bool areAllFieldsBuilt = true;
    for (int index = 0; index < stm.fields.size(); ++index) {
        auto field = stm.fields[index].get();
        if( !field ) {
            areAllFieldsBuilt = false;
            break;
        }
        field->Accept( *this );
    }
    if( areAllFieldsBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}